

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O2

void duckdb_je_edata_cache_fast_disable(tsdn_t *tsdn,edata_cache_fast_t *ecs)

{
  atomic_zu_t *paVar1;
  edata_t *item;
  edata_cache_t *peVar2;
  long lVar3;
  
  malloc_mutex_lock(tsdn,&ecs->fallback->mtx);
  lVar3 = 0;
  while (item = (ecs->list).head.qlh_first, item != (edata_t *)0x0) {
    edata_list_inactive_remove(&ecs->list,item);
    duckdb_je_edata_avail_insert(&ecs->fallback->avail,item);
    lVar3 = lVar3 + 1;
  }
  paVar1 = &ecs->fallback->count;
  paVar1->repr = paVar1->repr + lVar3;
  peVar2 = ecs->fallback;
  (peVar2->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(peVar2->mtx).field_0 + 0x48));
  ecs->disabled = true;
  return;
}

Assistant:

void
edata_cache_fast_disable(tsdn_t *tsdn, edata_cache_fast_t *ecs) {
	edata_cache_fast_flush_all(tsdn, ecs);
	ecs->disabled = true;
}